

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> * __thiscall
Parser::parseObjectDeclarationExpression
          (optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  element_type *peVar3;
  shared_ptr<ExpressionAstNode> *__args_1;
  TokenType type;
  undefined1 local_218 [24];
  string local_200 [32];
  undefined1 local_1e0 [24];
  string local_1c8 [32];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> value;
  string local_168 [32];
  undefined1 local_148 [24];
  string local_130 [32];
  undefined1 local_110 [8];
  shared_ptr<Token> key;
  string local_f8 [32];
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  string local_b0 [32];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  keyValues;
  string local_50 [32];
  undefined1 local_30 [23];
  undefined1 local_19 [8];
  bool error;
  Parser *this_local;
  
  local_19[0] = (_Alloc_hider)0x0;
  unique0x10000963 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"Expected a left curly bracket to begin object declaration",
             (allocator<char> *)
             ((long)&keyValues.
                     super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  type = (TokenType)this;
  expect((Parser *)local_30,type,(bool *)0x2,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&keyValues.
                     super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ::vector((vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
            *)local_70);
  while( true ) {
    skipWhiteSpace(this);
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)local_80);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_80);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_80);
    if (TVar1 == EndOfFile) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_b0,"Expected a right curly bracket to end object declaration",
                 (allocator<char> *)(local_c8 + 0x17));
      expect((Parser *)local_90,type,(bool *)0x3,(string *)local_19);
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)(local_c8 + 0x17));
      std::optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>::optional
                (__return_storage_ptr__);
      goto LAB_0010fb53;
    }
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)local_c8);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_c8);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_c8);
    if (TVar1 == RightCurly) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_130,"Expected identifier as parameter of function definition",
               (allocator<char> *)(local_148 + 0x17));
    expect((Parser *)local_110,type,(bool *)0x18,(string *)local_19);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)(local_148 + 0x17));
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_110);
    if (peVar3->tokenType != Identifier) {
      local_19[0] = (_Alloc_hider)0x1;
    }
    skipWhiteSpace(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_168,"Expected a colon between object key and value",
               (allocator<char> *)
               &value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
    expect((Parser *)local_148,type,(bool *)0x17,(string *)local_19);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_148);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
    parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_188,this);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_188);
    if (!bVar2) {
      local_19[0] = (_Alloc_hider)0x1;
    }
    if (((byte)local_19[0] & 1) == 0) {
      __args_1 = std::optional<std::shared_ptr<ExpressionAstNode>_>::value
                           ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_188);
      std::
      vector<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>,std::allocator<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>>>
      ::emplace_back<std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
                ((vector<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>,std::allocator<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>>>
                  *)local_70,(shared_ptr<Token> *)local_110,__args_1);
    }
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)local_198);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_198);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_198);
    if (TVar1 == RightCurly) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1c8,"Expected a right curly bracket to end object declaration",
                 (allocator<char> *)(local_1e0 + 0x17));
      expect((Parser *)local_1a8,type,(bool *)0x3,(string *)local_19);
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_1a8);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)(local_1e0 + 0x17));
      local_c8._16_4_ = 3;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_200,"Expected a comma between object key-value pairs",
                 (allocator<char> *)(local_218 + 0x17));
      expect((Parser *)local_1e0,type,(bool *)0x13,(string *)local_19);
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_1e0);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)(local_218 + 0x17));
      local_c8._16_4_ = 0;
    }
    std::optional<std::shared_ptr<ExpressionAstNode>_>::~optional
              ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_188);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_110);
    if (local_c8._16_4_ != 0) {
LAB_0010fafa:
      if (((byte)local_19[0] & 1) == 0) {
        std::
        make_shared<ObjectDeclarationExpressionAstNode,std::vector<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>,std::allocator<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>>>&>
                  ((vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                    *)local_218);
        std::optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>::
        optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_true>
                  (__return_storage_ptr__,
                   (shared_ptr<ObjectDeclarationExpressionAstNode> *)local_218);
        std::shared_ptr<ObjectDeclarationExpressionAstNode>::~shared_ptr
                  ((shared_ptr<ObjectDeclarationExpressionAstNode> *)local_218);
      }
      else {
        std::optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>::optional
                  (__return_storage_ptr__);
      }
LAB_0010fb53:
      local_c8._16_4_ = 1;
      std::
      vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ::~vector((vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                 *)local_70);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"Expected a right curly bracket to end object declaration",
             (allocator<char> *)
             ((long)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 7
             ));
  expect((Parser *)local_d8,type,(bool *)0x3,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 7
             ));
  goto LAB_0010fafa;
}

Assistant:

const std::optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>>
Parser::parseObjectDeclarationExpression() noexcept {
  bool error = false;
  this->expect(TokenType::LeftCurly, error,
    "Expected a left curly bracket to begin object declaration");

  std::vector<std::pair<std::shared_ptr<Token>, std::shared_ptr<ExpressionAstNode>>> keyValues;

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end object declaration");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end object declaration");
      break;
    }

    auto key = this->expect(TokenType::Identifier, error,
      "Expected identifier as parameter of function definition");

    if (key->tokenType != TokenType::Identifier) {
      error = true;
    }

    this->skipWhiteSpace();

    this->expect(TokenType::Colon, error, "Expected a colon between object key and value");

    auto value = this->parseExpression();

    if (!value) {
      error = true;
    }

    if (!error) {
      keyValues.emplace_back(key, value.value());
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end object declaration");
      break;
    }

    this->expect(TokenType::Comma, error, "Expected a comma between object key-value pairs");
  }

  if (error) { return std::nullopt; }

  return std::make_shared<ObjectDeclarationExpressionAstNode>(keyValues);
}